

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

void test_insert(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  _Alloc_hider _Var3;
  _Head_base<0UL,_argo::json_*,_false> _Var4;
  json *this;
  ostream *poVar5;
  pointer *__ptr;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> x;
  json o;
  string local_e8;
  _Head_base<0UL,_argo::json_*,_false> local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [72];
  json local_68;
  
  argo::json::json(&local_68,object_e);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"one","");
  argo::json::json((json *)local_c0,1);
  argo::json::insert(&local_68,&local_e8,(json *)local_c0);
  argo::json::~json((json *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"two","");
  argo::json::json((json *)local_c0,2.123);
  argo::json::insert(&local_68,&local_e8,(json *)local_c0);
  argo::json::~json((json *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"three","");
  argo::json::json((json *)local_c0,"asfdsad");
  argo::json::insert(&local_68,&local_e8,(json *)local_c0);
  argo::json::~json((json *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  this = (json *)operator_new(0x58);
  argo::json::json(this,1.23);
  puVar2 = (undefined1 *)((long)&((json *)local_c0)->m_value + 8);
  local_e8._M_dataplus._M_p = (pointer)this;
  local_c0[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"four","");
  local_c8._M_head_impl = (json *)local_e8._M_dataplus._M_p;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  argo::json::insert(&local_68,(string *)local_c0,
                     (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_c8);
  _Var4._M_head_impl = local_c8._M_head_impl;
  if (local_c8._M_head_impl != (json *)0x0) {
    argo::json::~json(local_c8._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  local_c8._M_head_impl = (json *)0x0;
  if (local_c0[0] != puVar2) {
    operator_delete(local_c0[0]);
  }
  poVar5 = argo::operator<<((ostream *)&jlog,&local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  _Var3._M_p = local_e8._M_dataplus._M_p;
  if ((json *)local_e8._M_dataplus._M_p != (json *)0x0) {
    argo::json::~json((json *)local_e8._M_dataplus._M_p);
    operator_delete(_Var3._M_p);
  }
  argo::json::~json(&local_68);
  return;
}

Assistant:

void test_insert()
{
    json o(json::object_e);

    o.insert("one", 1);
    o.insert("two", 2.123);
    o.insert("three", "asfdsad");
    unique_ptr<json> x(new json(1.23));
    o.insert("four", move(x));

    jlog << o << endl;
}